

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

int __thiscall
slang::SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::copy
          (SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> *this,
          EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  basic_string_view<char,_std::char_traits<char>_> *__ifirst;
  uninitialized_copy_result<const_std::basic_string_view<char>_*,_std::basic_string_view<char>_*>
  uVar1;
  pointer dest;
  undefined1 in_stack_ffffffffffffffc8 [16];
  BumpAllocator *in_stack_ffffffffffffffd8;
  int local_10;
  
  if (this->len == 0) {
    std::span<std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>::span
              ((span<std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
                *)0x6f93a9);
  }
  else {
    __ifirst = (basic_string_view<char,_std::char_traits<char>_> *)
               BumpAllocator::allocate
                         (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffc8._8_8_,
                          in_stack_ffffffffffffffc8._0_8_);
    begin(this);
    end(this);
    uVar1 = std::ranges::__uninitialized_copy_fn::
            operator()<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::basic_string_view<char,_std::char_traits<char>_>_*>
                      ((__uninitialized_copy_fn *)dst,__ifirst,in_stack_ffffffffffffffc8._8_8_,
                       in_stack_ffffffffffffffc8._0_8_,
                       (basic_string_view<char,_std::char_traits<char>_> *)this);
    std::span<std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>::
    span<std::basic_string_view<char,_std::char_traits<char>_>_*>
              ((span<std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
                *)uVar1.out,uVar1.in,(size_type)this);
  }
  return local_10;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }